

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O1

void __thiscall Imf_3_4::anon_unknown_7::LineBufferTask::execute(LineBufferTask *this)

{
  uint uVar1;
  LineBuffer *pLVar2;
  undefined8 xStride;
  Array<char> *pAVar3;
  long *plVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint64_t *puVar8;
  long lVar9;
  uint uVar10;
  PixelType PVar11;
  ulong uVar12;
  uint uVar13;
  Data *pDVar14;
  pointer puVar15;
  PixelType *pPVar16;
  ulong uVar17;
  bool bVar18;
  char *writePtr;
  char *readPtr;
  char *compPtr;
  int local_54;
  Array<char> *local_50;
  Array<char> *local_48;
  uint local_3c;
  long local_38;
  
  pLVar2 = this->_lineBuffer;
  if (*(int *)&(this->_ofd->frameBuffer)._sampleCounts.base == 0) {
    puVar8 = &pLVar2->dataSize;
    uVar10 = *(int *)((long)&pLVar2->dataSize + 4) + 1;
    local_54 = 1;
  }
  else {
    puVar8 = (uint64_t *)((long)&pLVar2->dataSize + 4);
    uVar10 = (int)pLVar2->dataSize - 1;
    local_54 = -1;
  }
  uVar13 = (uint)*puVar8;
  if (uVar13 != uVar10) {
    local_3c = uVar10;
    do {
      local_50 = (Array<char> *)
                 ((long)&((this->_lineBuffer->buffer)._data)->_size +
                 *(long *)(*(long *)&this->_ofd->maxY +
                          ((long)(int)uVar13 -
                          (long)*(int *)((long)&(this->_ofd->frameBuffer)._sampleCounts.xStride + 4)
                          ) * 8));
      pDVar14 = this->_ofd;
      puVar15 = (pDVar14->bytesPerLine).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((pDVar14->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar15) {
        uVar12 = 0;
        uVar17 = 1;
        do {
          uVar10 = *(uint *)((long)puVar15 + uVar12 * 0x30 + 0x24);
          if ((int)uVar13 < 0) {
            if (-1 < (int)uVar10) {
              uVar5 = (uVar10 + ~uVar13) / uVar10;
              goto LAB_00196562;
            }
            uVar5 = (~uVar10 - uVar13) / -uVar10;
          }
          else if ((int)uVar10 < 0) {
            uVar5 = uVar13 / -uVar10;
LAB_00196562:
            uVar5 = -uVar5;
          }
          else {
            uVar5 = uVar13 / uVar10;
          }
          if (uVar13 == uVar5 * uVar10) {
            pPVar16 = (PixelType *)(puVar15 + uVar12 * 6);
            uVar5 = *(uint *)((long)&(pDVar14->frameBuffer)._sampleCounts.base + 4);
            PVar11 = pPVar16[8];
            if ((int)uVar5 < 0) {
              if (-1 < (int)PVar11) {
                uVar5 = (~uVar5 + PVar11) / PVar11;
                goto LAB_001965b6;
              }
              uVar5 = (~PVar11 - uVar5) / -PVar11;
            }
            else if ((int)PVar11 < 0) {
              uVar5 = uVar5 / -PVar11;
LAB_001965b6:
              uVar5 = -uVar5;
            }
            else {
              uVar5 = uVar5 / PVar11;
            }
            uVar6 = (uint)(pDVar14->frameBuffer)._sampleCounts.xStride;
            if ((int)uVar6 < 0) {
              if (-1 < (int)PVar11) {
                uVar6 = ~uVar6 + PVar11;
                goto LAB_001965f4;
              }
              uVar6 = (~PVar11 - uVar6) / -PVar11;
            }
            else if ((int)PVar11 < 0) {
              PVar11 = -PVar11;
LAB_001965f4:
              uVar6 = -(uVar6 / PVar11);
            }
            else {
              uVar6 = uVar6 / PVar11;
            }
            if ((char)pPVar16[10] == HALF) {
              fillChannelWithZeroes
                        ((char **)&local_50,
                         *(Format *)
                          &(pDVar14->lineOffsets).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,*pPVar16,
                         (long)(int)((uVar6 - uVar5) + 1));
            }
            else {
              if ((int)uVar13 < 0) {
                if (-1 < (int)uVar10) {
                  uVar1 = uVar10 + ~uVar13;
                  goto LAB_00196655;
                }
                uVar10 = (~uVar10 - uVar13) / -uVar10;
              }
              else if ((int)uVar10 < 0) {
                uVar10 = -uVar10;
                uVar1 = uVar13;
LAB_00196655:
                uVar10 = -(uVar1 / uVar10);
              }
              else {
                uVar10 = uVar13 / uVar10;
              }
              lVar9 = (long)(int)uVar10 * *(undefined8 *)(pPVar16 + 6) +
                      *(undefined8 *)(pPVar16 + 2);
              xStride = *(undefined8 *)(pPVar16 + 4);
              local_48 = (Array<char> *)((long)(int)uVar5 * xStride + lVar9);
              copyFromFrameBuffer((char **)&local_50,(char **)&local_48,
                                  (char *)((long)(int)uVar6 * xStride + lVar9),xStride,
                                  *(Format *)
                                   &(pDVar14->lineOffsets).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,*pPVar16);
            }
          }
          pDVar14 = this->_ofd;
          puVar15 = (pDVar14->bytesPerLine).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar12 = ((long)(pDVar14->bytesPerLine).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar15 >> 4) *
                   -0x5555555555555555;
          bVar18 = uVar17 <= uVar12;
          lVar9 = uVar12 - uVar17;
          uVar12 = uVar17;
          uVar17 = (ulong)((int)uVar17 + 1);
        } while (bVar18 && lVar9 != 0);
      }
      if ((Array<char> *)this->_lineBuffer->dataPtr < local_50) {
        this->_lineBuffer->dataPtr = (char *)local_50;
      }
      uVar13 = uVar13 + local_54;
    } while (uVar13 != local_3c);
  }
  pLVar2 = this->_lineBuffer;
  if (((int)uVar13 < (int)pLVar2->uncompressedDataSize) ||
     (*(int *)((long)&pLVar2->uncompressedDataSize + 4) < (int)uVar13)) {
    pAVar3 = (pLVar2->buffer)._data;
    (pLVar2->consecutiveBuffer)._size = (long)pAVar3;
    *(int *)&(pLVar2->consecutiveBuffer)._data = *(int *)&pLVar2->dataPtr - (int)pAVar3;
    plVar4 = (long *)(pLVar2->sampleCountTableBuffer)._size;
    if (plVar4 != (long *)0x0) {
      iVar7 = (**(code **)(*plVar4 + 0x20))();
      pLVar2 = this->_lineBuffer;
      if (iVar7 < *(int *)&(pLVar2->consecutiveBuffer)._data) {
        *(int *)&(pLVar2->consecutiveBuffer)._data = iVar7;
        (pLVar2->consecutiveBuffer)._size = local_38;
      }
      else {
        pDVar14 = this->_ofd;
        if (*(int *)&(pDVar14->lineOffsets).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage == 0) {
          uVar10 = (uint)pLVar2->uncompressedDataSize;
          uVar13 = *(uint *)((long)&pLVar2->uncompressedDataSize + 4);
          local_50 = (pLVar2->buffer)._data;
          if ((int)uVar10 <= (int)uVar13) {
            do {
              local_48 = local_50;
              puVar15 = (pDVar14->bytesPerLine).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if ((pDVar14->bytesPerLine).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish != puVar15) {
                uVar12 = 0;
                uVar17 = 1;
                do {
                  uVar5 = *(uint *)((long)puVar15 + uVar12 * 0x30 + 0x24);
                  if ((int)uVar10 < 0) {
                    if (-1 < (int)uVar5) {
                      uVar6 = (uVar5 + ~uVar10) / uVar5;
                      goto LAB_001967f0;
                    }
                    uVar6 = (~uVar5 - uVar10) / -uVar5;
                  }
                  else if ((int)uVar5 < 0) {
                    uVar6 = uVar10 / -uVar5;
LAB_001967f0:
                    uVar6 = -uVar6;
                  }
                  else {
                    uVar6 = uVar10 / uVar5;
                  }
                  if (uVar10 == uVar6 * uVar5) {
                    uVar5 = *(uint *)((long)&(pDVar14->frameBuffer)._sampleCounts.base + 4);
                    PVar11 = *(PixelType *)((long)(puVar15 + uVar12 * 6) + 0x20);
                    if ((int)uVar5 < 0) {
                      if (-1 < (int)PVar11) {
                        uVar5 = (~uVar5 + PVar11) / PVar11;
                        goto LAB_00196843;
                      }
                      uVar5 = (~PVar11 - uVar5) / -PVar11;
                    }
                    else if ((int)PVar11 < 0) {
                      uVar5 = uVar5 / -PVar11;
LAB_00196843:
                      uVar5 = -uVar5;
                    }
                    else {
                      uVar5 = uVar5 / PVar11;
                    }
                    uVar6 = (uint)(pDVar14->frameBuffer)._sampleCounts.xStride;
                    if ((int)uVar6 < 0) {
                      if (-1 < (int)PVar11) {
                        uVar6 = ~uVar6 + PVar11;
                        goto LAB_0019687c;
                      }
                      uVar6 = (~PVar11 - uVar6) / -PVar11;
                    }
                    else if ((int)PVar11 < 0) {
                      PVar11 = -PVar11;
LAB_0019687c:
                      uVar6 = -(uVar6 / PVar11);
                    }
                    else {
                      uVar6 = uVar6 / PVar11;
                    }
                    convertInPlace((char **)&local_50,(char **)&local_48,
                                   *(PixelType *)(puVar15 + uVar12 * 6),
                                   (long)(int)((uVar6 - uVar5) + 1));
                  }
                  puVar15 = (pDVar14->bytesPerLine).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  uVar12 = ((long)(pDVar14->bytesPerLine).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar15 >> 4) *
                           -0x5555555555555555;
                  bVar18 = uVar17 <= uVar12;
                  lVar9 = uVar12 - uVar17;
                  uVar12 = uVar17;
                  uVar17 = (ulong)((int)uVar17 + 1);
                } while (bVar18 && lVar9 != 0);
              }
              bVar18 = uVar10 != uVar13;
              uVar10 = uVar10 + 1;
            } while (bVar18);
          }
        }
      }
    }
    *(undefined1 *)&(this->_lineBuffer->sampleCountTableBuffer)._data = 0;
  }
  return;
}

Assistant:

void
LineBufferTask::execute ()
{
    try
    {
        //
        // First copy the pixel data from the
        // frame buffer into the line buffer
        //

        int yStart, yStop, dy;

        if (_ofd->lineOrder == INCREASING_Y)
        {
            yStart = _lineBuffer->scanLineMin;
            yStop  = _lineBuffer->scanLineMax + 1;
            dy     = 1;
        }
        else
        {
            yStart = _lineBuffer->scanLineMax;
            yStop  = _lineBuffer->scanLineMin - 1;
            dy     = -1;
        }

        //
        // Allocate buffers for scanlines.
        // And calculate the sample counts for each line.
        //

        bytesPerDeepLineTable (
            _ofd->header,
            _lineBuffer->scanLineMin,
            _lineBuffer->scanLineMax,
            _ofd->sampleCountSliceBase,
            _ofd->sampleCountXStride,
            _ofd->sampleCountYStride,
            _ofd->bytesPerLine);
        for (int i = _lineBuffer->scanLineMin; i <= _lineBuffer->scanLineMax;
             i++)
        {
            // (TODO) don't do this all the time.
            _lineBuffer->buffer[i - _lineBuffer->minY].resizeErase (
                static_cast<long> (_ofd->bytesPerLine[i - _ofd->minY]));

            for (int j = _ofd->minX; j <= _ofd->maxX; j++)
                _ofd->lineSampleCount[i - _ofd->minY] +=
                    _ofd->getSampleCount (j, i);
        }

        //
        // Copy data from frame buffer to line buffer.
        //

        int y;

        for (y = yStart; y != yStop; y += dy)
        {
            //
            // Gather one scan line's worth of pixel data and store
            // them in _ofd->lineBuffer.
            //

            char* writePtr = &_lineBuffer->buffer[y - _lineBuffer->minY][0];
            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ofd->slices.size (); ++i)
            {
                //
                // Test if scan line y of this channel contains any data
                // (the scan line contains data only if y % ySampling == 0).
                //

                const OutSliceInfo& slice = *_ofd->slices[i];

                if (modp (y, slice.ySampling) != 0) continue;

                //
                // Fill the line buffer with with pixel data.
                //

                if (slice.zero)
                {
                    //
                    // The frame buffer contains no data for this channel.
                    // Store zeroes in _lineBuffer->buffer.
                    //

                    fillChannelWithZeroes (
                        writePtr,
                        _ofd->format,
                        slice.type,
                        _ofd->lineSampleCount[y - _ofd->minY]);
                }
                else
                {

                    copyFromDeepFrameBuffer (
                        writePtr,
                        slice.base,
                        _ofd->sampleCountSliceBase,
                        _ofd->sampleCountXStride,
                        _ofd->sampleCountYStride,
                        y,
                        _ofd->minX,
                        _ofd->maxX,
                        0,
                        0, //offsets for samplecount
                        0,
                        0, //offsets for data
                        slice.sampleStride,
                        slice.xStride,
                        slice.yStride,
                        _ofd->format,
                        slice.type);
                }
            }
        }

        //
        // If the next scanline isn't past the bounds of the lineBuffer
        // then we have partially filled the linebuffer,
        // otherwise the whole linebuffer is filled and then
        // we compress the linebuffer and write it out.
        //

        if (y >= _lineBuffer->minY && y <= _lineBuffer->maxY) return;

        //
        // Copy all data into a consecutive buffer.
        //

        uint64_t totalBytes      = 0;
        uint64_t maxBytesPerLine = 0;
        for (int i = 0; i < _lineBuffer->maxY - _lineBuffer->minY + 1; i++)
        {
            totalBytes += _lineBuffer->buffer[i].size ();
            if (uint64_t (_lineBuffer->buffer[i].size ()) > maxBytesPerLine)
                maxBytesPerLine = _lineBuffer->buffer[i].size ();
        }
        _lineBuffer->consecutiveBuffer.resizeErase (
            static_cast<long> (totalBytes));

        int pos = 0;
        for (int i = 0; i < _lineBuffer->maxY - _lineBuffer->minY + 1; i++)
        {
            memcpy (
                _lineBuffer->consecutiveBuffer + pos,
                &_lineBuffer->buffer[i][0],
                _lineBuffer->buffer[i].size ());
            pos += _lineBuffer->buffer[i].size ();
        }

        _lineBuffer->dataPtr = _lineBuffer->consecutiveBuffer;

        _lineBuffer->dataSize             = totalBytes;
        _lineBuffer->uncompressedDataSize = _lineBuffer->dataSize;

        //
        // Compress the pixel sample count table.
        //

        char*    ptr           = _lineBuffer->sampleCountTableBuffer;
        uint64_t tableDataSize = 0;
        for (int i = _lineBuffer->minY; i <= _lineBuffer->maxY; i++)
        {
            int count = 0;
            for (int j = _ofd->minX; j <= _ofd->maxX; j++)
            {
                count += _ofd->getSampleCount (j, i);
                Xdr::write<CharPtrIO> (ptr, count);
                tableDataSize += sizeof (int);
            }
        }

        if (_lineBuffer->sampleCountTableCompressor)
        {
            _lineBuffer->sampleCountTableSize =
                _lineBuffer->sampleCountTableCompressor->compress (
                    _lineBuffer->sampleCountTableBuffer,
                    static_cast<int> (tableDataSize),
                    _lineBuffer->minY,
                    _lineBuffer->sampleCountTablePtr);
        }

        //
        // If we can't make data shrink (or we weren't compressing), then just use the raw data.
        //

        if (!_lineBuffer->sampleCountTableCompressor ||
            _lineBuffer->sampleCountTableSize >= tableDataSize)
        {
            _lineBuffer->sampleCountTableSize = tableDataSize;
            _lineBuffer->sampleCountTablePtr =
                _lineBuffer->sampleCountTableBuffer;
        }

        //
        // Compress the sample data
        //

        // (TODO) don't do this all the time.
        if (_lineBuffer->compressor != 0) delete _lineBuffer->compressor;
        _lineBuffer->compressor = newCompressor (
            _ofd->header.compression (), maxBytesPerLine, _ofd->header);

        Compressor* compressor = _lineBuffer->compressor;

        if (compressor)
        {
            const char* compPtr;

            uint64_t compSize = compressor->compress (
                _lineBuffer->dataPtr,
                static_cast<int> (_lineBuffer->dataSize),
                _lineBuffer->minY,
                compPtr);

            if (compSize < _lineBuffer->dataSize)
            {
                _lineBuffer->dataSize = compSize;
                _lineBuffer->dataPtr  = compPtr;
            }
            else if (_ofd->format == Compressor::NATIVE)
            {
                //
                // The data did not shrink during compression, but
                // we cannot write to the file using the machine's
                // native format, so we need to convert the lineBuffer
                // to Xdr.
                //

                convertToXdr (
                    _ofd,
                    _lineBuffer->consecutiveBuffer,
                    _lineBuffer->minY,
                    _lineBuffer->maxY,
                    static_cast<int> (_lineBuffer->dataSize));
            }
        }

        _lineBuffer->partiallyFull = false;
    }
    catch (std::exception& e)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception    = e.what ();
            _lineBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception    = "unrecognized exception";
            _lineBuffer->hasException = true;
        }
    }
}